

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUISpriteBank::setTexture(CGUISpriteBank *this,u32 index,ITexture *texture)

{
  u32 uVar1;
  ITexture **ppIVar2;
  ITexture *in_RDX;
  uint in_ESI;
  IReferenceCounted *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar3;
  
  while( true ) {
    uVar3 = in_ESI;
    uVar1 = core::array<irr::video::ITexture_*>::size((array<irr::video::ITexture_*> *)0x3d3f72);
    if (uVar3 < uVar1) break;
    core::array<irr::video::ITexture_*>::push_back
              ((array<irr::video::ITexture_*> *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
               (ITexture **)in_stack_ffffffffffffffc8);
  }
  if (in_RDX != (ITexture *)0x0) {
    IReferenceCounted::grab
              ((IReferenceCounted *)
               ((long)&in_RDX->_vptr_ITexture + (long)in_RDX->_vptr_ITexture[-3]));
  }
  ppIVar2 = core::array<irr::video::ITexture_*>::operator[]
                      ((array<irr::video::ITexture_*> *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                       (u32)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  if (*ppIVar2 != (ITexture *)0x0) {
    core::array<irr::video::ITexture_*>::operator[]
              ((array<irr::video::ITexture_*> *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
               (u32)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    IReferenceCounted::drop(in_stack_ffffffffffffffc8);
  }
  ppIVar2 = core::array<irr::video::ITexture_*>::operator[]
                      ((array<irr::video::ITexture_*> *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                       (u32)((ulong)in_RDX >> 0x20));
  *ppIVar2 = in_RDX;
  return;
}

Assistant:

void CGUISpriteBank::setTexture(u32 index, video::ITexture *texture)
{
	while (index >= Textures.size())
		Textures.push_back(0);

	if (texture)
		texture->grab();

	if (Textures[index])
		Textures[index]->drop();

	Textures[index] = texture;
}